

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_GetBobOffset
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *this;
  VMValue *pVVar1;
  bool bVar2;
  double val;
  bool local_53;
  double u;
  double frac;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1dd8,
                  "int AF_AActor_GetBobOffset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    this = (AActor *)(param->field_0).field_1.a;
    local_53 = true;
    if (this != (AActor *)0x0) {
      local_53 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_53 != false) {
      if (numparam < 2) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar1->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1dd9,
                        "int AF_AActor_GetBobOffset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        u = (pVVar1->field_0).f;
      }
      else {
        if (param[1].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1dd9,
                        "int AF_AActor_GetBobOffset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        u = param[1].field_0.f;
      }
      val = AActor::GetBobOffset(this,u);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1dda,
                        "int AF_AActor_GetBobOffset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetFloat(ret,val);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1dd8,
                  "int AF_AActor_GetBobOffset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1dd8,
                "int AF_AActor_GetBobOffset(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetBobOffset)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT_DEF(frac);
	ACTION_RETURN_FLOAT(self->GetBobOffset(frac));
}